

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

char * __thiscall cmTarget::GetProperty(cmTarget *this,string *prop,cmMakefile *context)

{
  MessageType t;
  bool bVar1;
  __type _Var2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  PolicyStatus PVar6;
  ostream *poVar7;
  long lVar8;
  size_type sVar9;
  pointer pcVar10;
  cmTarget *pcVar11;
  cmTargetInternals *pcVar12;
  reference ppTVar13;
  cmCompiledGeneratorExpression *this_00;
  string *psVar14;
  reference pbVar15;
  pointer pbVar16;
  size_type sVar17;
  cmSourceFile *this_01;
  ulong uVar18;
  char *pcVar19;
  cmMakefile *pcVar20;
  cmState *this_02;
  PolicyID id;
  bool chain;
  char *retVal;
  allocator local_7d9;
  string local_7d8;
  string local_7b8 [8];
  string sname;
  cmSourceFileLocation *location;
  cmSourceFile *sf;
  string local_768;
  MessageType local_744;
  undefined1 local_740 [4];
  MessageType messageType;
  ostringstream e_1;
  undefined1 local_5c0 [6];
  bool noMessage;
  bool addContent;
  string objLibName;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_580;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_578;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_570;
  const_iterator li;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string entry;
  __normal_iterator<cmTargetInternals::TargetPropertyEntry_**,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
  local_528;
  __normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
  local_520;
  const_iterator i;
  char *sep_1;
  ostringstream ss;
  __normal_iterator<cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
  local_398;
  __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
  local_390;
  const_iterator end;
  __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
  local_380;
  const_iterator it;
  string sep;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_340;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_328;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_310;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_2f8;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_2e0;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_2c8;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_2b0;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_298;
  allocator local_279;
  allocator local_278;
  allocator local_277;
  allocator local_276;
  allocator local_275;
  allocator local_274;
  allocator local_273;
  allocator local_272;
  allocator local_271;
  int local_270;
  allocator local_269;
  undefined1 local_268 [8];
  string configName_1;
  allocator local_221;
  string local_220;
  char *local_200;
  char *configName;
  allocator local_1d1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream e;
  cmMakefile *context_local;
  string *prop_local;
  cmTarget *this_local;
  
  TVar4 = GetType(this);
  if ((TVar4 == INTERFACE_LIBRARY) && (bVar1 = whiteListedInterfaceProperty(prop), !bVar1)) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar7 = std::operator<<((ostream *)local_1a0,
                             "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \""
                            );
    poVar7 = std::operator<<(poVar7,(string *)prop);
    std::operator<<(poVar7,"\" is not allowed.");
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(context,FATAL_ERROR,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    return (char *)(cmTarget *)0x0;
  }
  TVar4 = GetType(this);
  if ((((TVar4 != EXECUTABLE) && (TVar4 = GetType(this), TVar4 != STATIC_LIBRARY)) &&
      (TVar4 = GetType(this), TVar4 != SHARED_LIBRARY)) &&
     ((TVar4 = GetType(this), TVar4 != MODULE_LIBRARY &&
      (TVar4 = GetType(this), TVar4 != UNKNOWN_LIBRARY)))) goto LAB_0052c39a;
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propLOCATION_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,
               "LOCATION",&local_1d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propLOCATION_abi_cxx11_);
  }
  _Var2 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                propLOCATION_abi_cxx11_);
  if (_Var2) {
    bVar1 = HandleLocationPropertyPolicy(this,context);
    if (!bVar1) {
      return (char *)(cmTarget *)0x0;
    }
    pcVar19 = GetLocationForBuild(this);
    cmPropertyMap::SetProperty
              (&this->Properties,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,
               pcVar19);
    goto LAB_0052c39a;
  }
  std::__cxx11::string::string((string *)&configName,(string *)prop);
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,10ul>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &configName,(char (*) [10])0x8c9577);
  std::__cxx11::string::~string((string *)&configName);
  if (bVar1) {
    bVar1 = HandleLocationPropertyPolicy(this,context);
    if (!bVar1) {
      return (char *)(cmTarget *)0x0;
    }
    lVar8 = std::__cxx11::string::c_str();
    local_200 = (char *)(lVar8 + 9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_220,(char *)(lVar8 + 9),&local_221);
    pcVar19 = GetLocation(this,&local_220);
    cmPropertyMap::SetProperty(&this->Properties,prop,pcVar19);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    goto LAB_0052c39a;
  }
  std::__cxx11::string::string((string *)(configName_1.field_2._M_local_buf + 8),(string *)prop);
  bVar1 = cmHasLiteralSuffix<std::__cxx11::string,10ul>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (configName_1.field_2._M_local_buf + 8),(char (*) [10])0x8c959a);
  std::__cxx11::string::~string((string *)(configName_1.field_2._M_local_buf + 8));
  if (!bVar1) goto LAB_0052c39a;
  pcVar19 = (char *)std::__cxx11::string::c_str();
  lVar8 = std::__cxx11::string::size();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_268,pcVar19,lVar8 - 9,&local_269);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_268,"IMPORTED");
  if (bVar1) {
    bVar1 = HandleLocationPropertyPolicy(this,context);
    if (bVar1) {
      pcVar19 = GetLocation(this,(string *)local_268);
      cmPropertyMap::SetProperty(&this->Properties,prop,pcVar19);
      goto LAB_0052c36b;
    }
    this_local = (cmTarget *)0x0;
    local_270 = 1;
  }
  else {
LAB_0052c36b:
    local_270 = 0;
  }
  std::__cxx11::string::~string((string *)local_268);
  if (local_270 != 0) {
    return (char *)this_local;
  }
LAB_0052c39a:
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   specialProps_abi_cxx11_), iVar5 != 0)) {
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::hash_set(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_);
    __cxa_atexit(cmsys::
                 hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                 ::~hash_set,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         specialProps_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLINK_LIBRARIES_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                      propLINK_LIBRARIES_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLINK_LIBRARIES_abi_cxx11_,
               "LINK_LIBRARIES",&local_271);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propLINK_LIBRARIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propLINK_LIBRARIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propTYPE_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_,
               "TYPE",&local_272);
    std::allocator<char>::~allocator((allocator<char> *)&local_272);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propINCLUDE_DIRECTORIES_abi_cxx11_ ==
       '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propINCLUDE_DIRECTORIES_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propINCLUDE_DIRECTORIES_abi_cxx11_,"INCLUDE_DIRECTORIES",&local_273);
    std::allocator<char>::~allocator((allocator<char> *)&local_273);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propINCLUDE_DIRECTORIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propINCLUDE_DIRECTORIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_FEATURES_abi_cxx11_ == '\0'
      ) && (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         propCOMPILE_FEATURES_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propCOMPILE_FEATURES_abi_cxx11_,"COMPILE_FEATURES",&local_274);
    std::allocator<char>::~allocator((allocator<char> *)&local_274);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propCOMPILE_FEATURES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_FEATURES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_OPTIONS_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                      propCOMPILE_OPTIONS_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_OPTIONS_abi_cxx11_
               ,"COMPILE_OPTIONS",&local_275);
    std::allocator<char>::~allocator((allocator<char> *)&local_275);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propCOMPILE_OPTIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_OPTIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_DEFINITIONS_abi_cxx11_ ==
       '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propCOMPILE_DEFINITIONS_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propCOMPILE_DEFINITIONS_abi_cxx11_,"COMPILE_DEFINITIONS",&local_276);
    std::allocator<char>::~allocator((allocator<char> *)&local_276);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propCOMPILE_DEFINITIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_DEFINITIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propIMPORTED_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_,
               "IMPORTED",&local_277);
    std::allocator<char>::~allocator((allocator<char> *)&local_277);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propIMPORTED_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propNAME_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_,
               "NAME",&local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_278);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propSOURCES_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_,
               "SOURCES",&local_279);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propSOURCES_abi_cxx11_);
  }
  bVar1 = cmsys::
          hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::empty(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_);
  if (bVar1) {
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_298,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLINK_LIBRARIES_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_2b0,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_2c8,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
              propINCLUDE_DIRECTORIES_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_2e0,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_FEATURES_abi_cxx11_)
    ;
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_2f8,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_OPTIONS_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_310,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
              propCOMPILE_DEFINITIONS_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_328,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_340,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
              *)((long)&sep.field_2 + 8),
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_);
  }
  sVar9 = cmsys::
          hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::count(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
                  prop);
  if (sVar9 != 0) {
    _Var2 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propLINK_LIBRARIES_abi_cxx11_);
    if (_Var2) {
      pcVar12 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar1 = std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::empty
                        (&pcVar12->LinkImplementationPropertyEntries);
      if (!bVar1) {
        if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') &&
           (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         output_abi_cxx11_), iVar5 != 0)) {
          std::__cxx11::string::string
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                       &__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                               output_abi_cxx11_);
        }
        std::__cxx11::string::operator=
                  ((string *)
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,"");
        std::__cxx11::string::string((string *)&it);
        pcVar12 = cmTargetInternalPointer::operator->(&this->Internal);
        end._M_current =
             (cmValueWithOrigin *)
             std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::begin
                       (&pcVar12->LinkImplementationPropertyEntries);
        __gnu_cxx::
        __normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>
        ::__normal_iterator<cmValueWithOrigin*>
                  ((__normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>
                    *)&local_380,
                   (__normal_iterator<cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                    *)&end);
        pcVar12 = cmTargetInternalPointer::operator->(&this->Internal);
        local_398._M_current =
             (cmValueWithOrigin *)
             std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::end
                       (&pcVar12->LinkImplementationPropertyEntries);
        __gnu_cxx::
        __normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>
        ::__normal_iterator<cmValueWithOrigin*>
                  ((__normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>
                    *)&local_390,&local_398);
        while (bVar1 = __gnu_cxx::operator!=(&local_380,&local_390), bVar1) {
          std::__cxx11::string::operator+=
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                     (string *)&it);
          pcVar10 = __gnu_cxx::
                    __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                    ::operator->(&local_380);
          std::__cxx11::string::operator+=
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                     (string *)pcVar10);
          std::__cxx11::string::operator=((string *)&it,";");
          __gnu_cxx::
          __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
          ::operator++(&local_380);
        }
        pcVar11 = (cmTarget *)std::__cxx11::string::c_str();
        local_270 = 1;
        std::__cxx11::string::~string((string *)&it);
        return (char *)pcVar11;
      }
      return (char *)(cmTarget *)0x0;
    }
    _Var2 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propTYPE_abi_cxx11_);
    if (_Var2) {
      TVar4 = GetType(this);
      pcVar11 = (cmTarget *)GetTargetTypeName(TVar4);
      return (char *)pcVar11;
    }
    _Var2 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propINCLUDE_DIRECTORIES_abi_cxx11_);
    if (_Var2) {
      pcVar12 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar1 = std::
              vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              ::empty(&pcVar12->IncludeDirectoriesEntries);
      if (!bVar1) {
        if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') &&
           (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         output_abi_cxx11_), iVar5 != 0)) {
          std::__cxx11::string::string
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                       &__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                               output_abi_cxx11_);
        }
        pcVar12 = cmTargetInternalPointer::operator->(&this->Internal);
        MakePropertyList(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                         &pcVar12->IncludeDirectoriesEntries);
        pcVar11 = (cmTarget *)std::__cxx11::string::c_str();
        return (char *)pcVar11;
      }
      return (char *)(cmTarget *)0x0;
    }
    _Var2 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propCOMPILE_FEATURES_abi_cxx11_);
    if (_Var2) {
      pcVar12 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar1 = std::
              vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              ::empty(&pcVar12->CompileFeaturesEntries);
      if (!bVar1) {
        if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') &&
           (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         output_abi_cxx11_), iVar5 != 0)) {
          std::__cxx11::string::string
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                       &__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                               output_abi_cxx11_);
        }
        pcVar12 = cmTargetInternalPointer::operator->(&this->Internal);
        MakePropertyList(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                         &pcVar12->CompileFeaturesEntries);
        pcVar11 = (cmTarget *)std::__cxx11::string::c_str();
        return (char *)pcVar11;
      }
      return (char *)(cmTarget *)0x0;
    }
    _Var2 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propCOMPILE_OPTIONS_abi_cxx11_);
    if (_Var2) {
      pcVar12 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar1 = std::
              vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              ::empty(&pcVar12->CompileOptionsEntries);
      if (!bVar1) {
        if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') &&
           (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         output_abi_cxx11_), iVar5 != 0)) {
          std::__cxx11::string::string
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                       &__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                               output_abi_cxx11_);
        }
        pcVar12 = cmTargetInternalPointer::operator->(&this->Internal);
        MakePropertyList(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                         &pcVar12->CompileOptionsEntries);
        pcVar11 = (cmTarget *)std::__cxx11::string::c_str();
        return (char *)pcVar11;
      }
      return (char *)(cmTarget *)0x0;
    }
    _Var2 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propCOMPILE_DEFINITIONS_abi_cxx11_);
    if (_Var2) {
      pcVar12 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar1 = std::
              vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              ::empty(&pcVar12->CompileDefinitionsEntries);
      if (!bVar1) {
        if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') &&
           (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         output_abi_cxx11_), iVar5 != 0)) {
          std::__cxx11::string::string
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                       &__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                               output_abi_cxx11_);
        }
        pcVar12 = cmTargetInternalPointer::operator->(&this->Internal);
        MakePropertyList(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                         &pcVar12->CompileDefinitionsEntries);
        pcVar11 = (cmTarget *)std::__cxx11::string::c_str();
        return (char *)pcVar11;
      }
      return (char *)(cmTarget *)0x0;
    }
    _Var2 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propIMPORTED_abi_cxx11_);
    if (_Var2) {
      bVar1 = IsImported(this);
      if (!bVar1) {
        return (char *)(cmTarget *)"FALSE";
      }
      return (char *)(cmTarget *)"TRUE";
    }
    _Var2 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propNAME_abi_cxx11_);
    if (_Var2) {
      GetName_abi_cxx11_(this);
      pcVar11 = (cmTarget *)std::__cxx11::string::c_str();
      return (char *)pcVar11;
    }
    _Var2 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propSOURCES_abi_cxx11_);
    if (_Var2) {
      pcVar12 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar1 = std::
              vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              ::empty(&pcVar12->SourceEntries);
      if (bVar1) {
        return (char *)(cmTarget *)0x0;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&sep_1);
      i._M_current = (TargetPropertyEntry **)0x90a50f;
      pcVar12 = cmTargetInternalPointer::operator->(&this->Internal);
      local_528._M_current =
           (TargetPropertyEntry **)
           std::
           vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
           ::begin(&pcVar12->SourceEntries);
      __gnu_cxx::
      __normal_iterator<cmTargetInternals::TargetPropertyEntry*const*,std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>
      ::__normal_iterator<cmTargetInternals::TargetPropertyEntry**>
                ((__normal_iterator<cmTargetInternals::TargetPropertyEntry*const*,std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>
                  *)&local_520,&local_528);
      while( true ) {
        pcVar12 = cmTargetInternalPointer::operator->(&this->Internal);
        entry.field_2._8_8_ =
             std::
             vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
             ::end(&pcVar12->SourceEntries);
        bVar1 = __gnu_cxx::operator!=
                          (&local_520,
                           (__normal_iterator<cmTargetInternals::TargetPropertyEntry_**,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
                            *)((long)&entry.field_2 + 8));
        if (!bVar1) break;
        ppTVar13 = __gnu_cxx::
                   __normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
                   ::operator*(&local_520);
        this_00 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&(*ppTVar13)->ge);
        psVar14 = cmCompiledGeneratorExpression::GetInput_abi_cxx11_(this_00);
        std::__cxx11::string::string
                  ((string *)
                   &files.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar14);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&li);
        cmSystemTools::ExpandListArgument
                  ((string *)
                   &files.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&li,false);
        local_578._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&li);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_570,&local_578);
        while( true ) {
          local_580._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&li);
          bVar1 = __gnu_cxx::operator!=(&local_570,&local_580);
          if (!bVar1) break;
          pbVar15 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_570);
          std::__cxx11::string::string
                    ((string *)(objLibName.field_2._M_local_buf + 8),(string *)pbVar15);
          bVar3 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&objLibName.field_2 + 8),(char (*) [18])"$<TARGET_OBJECTS:");
          bVar1 = false;
          if (bVar3) {
            pbVar15 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_570);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator->(&local_570);
            std::__cxx11::string::size();
            pcVar19 = (char *)std::__cxx11::string::operator[]((ulong)pbVar15);
            bVar1 = *pcVar19 == '>';
          }
          std::__cxx11::string::~string((string *)(objLibName.field_2._M_local_buf + 8));
          if (bVar1) {
            pbVar16 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator->(&local_570);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator->(&local_570);
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_5c0,(ulong)pbVar16);
            sVar17 = cmGeneratorExpression::Find((string *)local_5c0);
            if (sVar17 == 0xffffffffffffffff) {
              bVar3 = false;
              bVar1 = true;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_740);
              local_744 = AUTHOR_WARNING;
              PVar6 = cmMakefile::GetPolicyStatus(context,CMP0051);
              if (PVar6 != OLD) {
                if (PVar6 == WARN) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_768,(cmPolicies *)0x33,id);
                  poVar7 = std::operator<<((ostream *)local_740,(string *)&local_768);
                  std::operator<<(poVar7,"\n");
                  std::__cxx11::string::~string((string *)&local_768);
                  bVar1 = false;
                }
                else if (PVar6 - NEW < 3) {
                  bVar3 = true;
                }
              }
              if (!bVar1) {
                poVar7 = std::operator<<((ostream *)local_740,"Target \"");
                poVar7 = std::operator<<(poVar7,(string *)&this->Name);
                std::operator<<(poVar7,
                                "\" contains $<TARGET_OBJECTS> generator expression in its sources list.  This content was not previously part of the SOURCES property when that property was read at configure time.  Code reading that property needs to be adapted to ignore the generator expression using the string(GENEX_STRIP) command."
                               );
                t = local_744;
                std::__cxx11::ostringstream::str();
                cmMakefile::IssueMessage(context,t,(string *)&sf);
                std::__cxx11::string::~string((string *)&sf);
              }
              if (bVar3) {
                std::operator<<((ostream *)&sep_1,(char *)i._M_current);
                i._M_current = (TargetPropertyEntry **)0x8c203d;
                pbVar15 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_570);
                std::operator<<((ostream *)&sep_1,(string *)pbVar15);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_740);
              local_270 = 0;
            }
            else {
              std::operator<<((ostream *)&sep_1,(char *)i._M_current);
              i._M_current = (TargetPropertyEntry **)0x8c203d;
              pbVar15 = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_570);
              std::operator<<((ostream *)&sep_1,(string *)pbVar15);
              local_270 = 10;
            }
            std::__cxx11::string::~string((string *)local_5c0);
          }
          else {
            pbVar15 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_570);
            sVar17 = cmGeneratorExpression::Find(pbVar15);
            if (sVar17 == 0xffffffffffffffff) {
              std::operator<<((ostream *)&sep_1,(char *)i._M_current);
              i._M_current = (TargetPropertyEntry **)0x8c203d;
              pbVar15 = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_570);
              std::operator<<((ostream *)&sep_1,(string *)pbVar15);
            }
            else {
              pcVar20 = this->Makefile;
              pbVar15 = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_570);
              this_01 = cmMakefile::GetOrCreateSource(pcVar20,pbVar15,false);
              sname.field_2._8_8_ = cmSourceFile::GetLocation(this_01);
              psVar14 = cmSourceFileLocation::GetDirectory_abi_cxx11_
                                  ((cmSourceFileLocation *)sname.field_2._8_8_);
              std::__cxx11::string::string(local_7b8,(string *)psVar14);
              uVar18 = std::__cxx11::string::empty();
              if ((uVar18 & 1) == 0) {
                std::__cxx11::string::operator+=(local_7b8,"/");
              }
              psVar14 = cmSourceFileLocation::GetName_abi_cxx11_
                                  ((cmSourceFileLocation *)sname.field_2._8_8_);
              std::__cxx11::string::operator+=(local_7b8,(string *)psVar14);
              std::operator<<((ostream *)&sep_1,(char *)i._M_current);
              i._M_current = (TargetPropertyEntry **)0x8c203d;
              std::operator<<((ostream *)&sep_1,local_7b8);
              std::__cxx11::string::~string(local_7b8);
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_570);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&li);
        std::__cxx11::string::~string
                  ((string *)
                   &files.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
        ::operator++(&local_520);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_7d8,"SOURCES",&local_7d9);
      std::__cxx11::ostringstream::str();
      pcVar19 = (char *)std::__cxx11::string::c_str();
      cmPropertyMap::SetProperty(&this->Properties,&local_7d8,pcVar19);
      std::__cxx11::string::~string((string *)&retVal);
      std::__cxx11::string::~string((string *)&local_7d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sep_1);
    }
  }
  this_local = (cmTarget *)cmPropertyMap::GetPropertyValue(&this->Properties,prop);
  if (this_local == (cmTarget *)0x0) {
    pcVar20 = GetMakefile(this);
    this_02 = cmMakefile::GetState(pcVar20);
    bVar1 = cmState::IsPropertyChained(this_02,prop,TARGET);
    if (bVar1) {
      this_local = (cmTarget *)cmMakefile::GetProperty(this->Makefile,prop,bVar1);
    }
  }
  return (char *)this_local;
}

Assistant:

const char *cmTarget::GetProperty(const std::string& prop,
                                  cmMakefile* context) const
{
  if (this->GetType() == INTERFACE_LIBRARY
      && !whiteListedInterfaceProperty(prop))
    {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \"" << prop << "\" is not allowed.";
    context->IssueMessage(cmake::FATAL_ERROR, e.str());
    return 0;
    }

  // Watch for special "computed" properties that are dependent on
  // other properties or variables.  Always recompute them.
  if(this->GetType() == cmTarget::EXECUTABLE ||
     this->GetType() == cmTarget::STATIC_LIBRARY ||
     this->GetType() == cmTarget::SHARED_LIBRARY ||
     this->GetType() == cmTarget::MODULE_LIBRARY ||
     this->GetType() == cmTarget::UNKNOWN_LIBRARY)
    {
    static const std::string propLOCATION = "LOCATION";
    if(prop == propLOCATION)
      {
      if (!this->HandleLocationPropertyPolicy(context))
        {
        return 0;
        }

      // Set the LOCATION property of the target.
      //
      // For an imported target this is the location of an arbitrary
      // available configuration.
      //
      // For a non-imported target this is deprecated because it
      // cannot take into account the per-configuration name of the
      // target because the configuration type may not be known at
      // CMake time.
      this->Properties.SetProperty(propLOCATION, this->GetLocationForBuild());
      }

    // Support "LOCATION_<CONFIG>".
    else if(cmHasLiteralPrefix(prop, "LOCATION_"))
      {
      if (!this->HandleLocationPropertyPolicy(context))
        {
        return 0;
        }
      const char* configName = prop.c_str() + 9;
      this->Properties.SetProperty(prop, this->GetLocation(configName));
      }
    // Support "<CONFIG>_LOCATION".
    else if(cmHasLiteralSuffix(prop, "_LOCATION"))
      {
      std::string configName(prop.c_str(), prop.size() - 9);
      if(configName != "IMPORTED")
        {
        if (!this->HandleLocationPropertyPolicy(context))
          {
          return 0;
          }
        this->Properties.SetProperty(prop, this->GetLocation(configName));
        }
      }
    }
  static UNORDERED_SET<std::string> specialProps;
#define MAKE_STATIC_PROP(PROP) \
  static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(TYPE);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(IMPORTED);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(SOURCES);
#undef MAKE_STATIC_PROP
  if(specialProps.empty())
    {
    specialProps.insert(propLINK_LIBRARIES);
    specialProps.insert(propTYPE);
    specialProps.insert(propINCLUDE_DIRECTORIES);
    specialProps.insert(propCOMPILE_FEATURES);
    specialProps.insert(propCOMPILE_OPTIONS);
    specialProps.insert(propCOMPILE_DEFINITIONS);
    specialProps.insert(propIMPORTED);
    specialProps.insert(propNAME);
    specialProps.insert(propSOURCES);
    }
  if(specialProps.count(prop))
    {
    if(prop == propLINK_LIBRARIES)
      {
      if (this->Internal->LinkImplementationPropertyEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = "";
      std::string sep;
      for (std::vector<cmValueWithOrigin>::const_iterator
          it = this->Internal->LinkImplementationPropertyEntries.begin(),
          end = this->Internal->LinkImplementationPropertyEntries.end();
          it != end; ++it)
        {
        output += sep;
        output += it->Value;
        sep = ";";
        }
      return output.c_str();
      }
    // the type property returns what type the target is
    else if (prop == propTYPE)
      {
      return cmTarget::GetTargetTypeName(this->GetType());
      }
    else if(prop == propINCLUDE_DIRECTORIES)
      {
      if (this->Internal->IncludeDirectoriesEntries.empty())
        {
        return 0;
        }

      static std::string output;
      MakePropertyList(output, this->Internal->IncludeDirectoriesEntries);
      return output.c_str();
      }
    else if(prop == propCOMPILE_FEATURES)
      {
      if (this->Internal->CompileFeaturesEntries.empty())
        {
        return 0;
        }

      static std::string output;
      MakePropertyList(output, this->Internal->CompileFeaturesEntries);
      return output.c_str();
      }
    else if(prop == propCOMPILE_OPTIONS)
      {
      if (this->Internal->CompileOptionsEntries.empty())
        {
        return 0;
        }

      static std::string output;
      MakePropertyList(output, this->Internal->CompileOptionsEntries);
      return output.c_str();
      }
    else if(prop == propCOMPILE_DEFINITIONS)
      {
      if (this->Internal->CompileDefinitionsEntries.empty())
        {
        return 0;
        }

      static std::string output;
      MakePropertyList(output, this->Internal->CompileDefinitionsEntries);
      return output.c_str();
      }
    else if (prop == propIMPORTED)
      {
      return this->IsImported()?"TRUE":"FALSE";
      }
    else if (prop == propNAME)
      {
      return this->GetName().c_str();
      }
    else if(prop == propSOURCES)
      {
      if (this->Internal->SourceEntries.empty())
        {
        return 0;
        }

      std::ostringstream ss;
      const char* sep = "";
      typedef cmTargetInternals::TargetPropertyEntry
                                  TargetPropertyEntry;
      for(std::vector<TargetPropertyEntry*>::const_iterator
            i = this->Internal->SourceEntries.begin();
          i != this->Internal->SourceEntries.end(); ++i)
        {
        std::string entry = (*i)->ge->GetInput();

        std::vector<std::string> files;
        cmSystemTools::ExpandListArgument(entry, files);
        for (std::vector<std::string>::const_iterator
            li = files.begin(); li != files.end(); ++li)
          {
          if(cmHasLiteralPrefix(*li, "$<TARGET_OBJECTS:") &&
              (*li)[li->size() - 1] == '>')
            {
            std::string objLibName = li->substr(17, li->size()-18);

            if (cmGeneratorExpression::Find(objLibName) != std::string::npos)
              {
              ss << sep;
              sep = ";";
              ss << *li;
              continue;
              }

            bool addContent = false;
            bool noMessage = true;
            std::ostringstream e;
            cmake::MessageType messageType = cmake::AUTHOR_WARNING;
            switch(context->GetPolicyStatus(cmPolicies::CMP0051))
              {
              case cmPolicies::WARN:
                e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
                noMessage = false;
              case cmPolicies::OLD:
                break;
              case cmPolicies::REQUIRED_ALWAYS:
              case cmPolicies::REQUIRED_IF_USED:
              case cmPolicies::NEW:
                addContent = true;
              }
            if (!noMessage)
              {
              e << "Target \"" << this->Name << "\" contains "
              "$<TARGET_OBJECTS> generator expression in its sources list.  "
              "This content was not previously part of the SOURCES property "
              "when that property was read at configure time.  Code reading "
              "that property needs to be adapted to ignore the generator "
              "expression using the string(GENEX_STRIP) command.";
              context->IssueMessage(messageType, e.str());
              }
            if (addContent)
              {
              ss << sep;
              sep = ";";
              ss << *li;
              }
            }
          else if (cmGeneratorExpression::Find(*li) == std::string::npos)
            {
            ss << sep;
            sep = ";";
            ss << *li;
            }
          else
            {
            cmSourceFile *sf = this->Makefile->GetOrCreateSource(*li);
            // Construct what is known about this source file location.
            cmSourceFileLocation const& location = sf->GetLocation();
            std::string sname = location.GetDirectory();
            if(!sname.empty())
              {
              sname += "/";
              }
            sname += location.GetName();

            ss << sep;
            sep = ";";
            // Append this list entry.
            ss << sname;
            }
          }
        }
      this->Properties.SetProperty("SOURCES", ss.str().c_str());
      }
    }

  const char *retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal)
    {
    const bool chain = this->GetMakefile()->GetState()->
                      IsPropertyChained(prop, cmProperty::TARGET);
    if (chain)
      {
      return this->Makefile->GetProperty(prop, chain);
      }
    }
  return retVal;
}